

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iptables.c
# Opt level: O1

void free_chain(ip_chain_t *ipc)

{
  list_head *plVar1;
  list_head *plVar2;
  
  if (ipc == (ip_chain_t *)0x0) {
    return;
  }
  plVar1 = (ipc->list).next;
  plVar1->prev = (ipc->list).prev;
  ((ipc->list).prev)->next = plVar1;
  (ipc->list).next = (list_head *)0x0;
  (ipc->list).prev = (list_head *)0x0;
  plVar1 = (ipc->rules).next;
  while (plVar1 != &ipc->rules) {
    plVar2 = plVar1->next;
    free_rule((ip_rule_t *)(plVar1 + -5));
    plVar1 = plVar2;
  }
  mwFree(ipc,"/workspace/llm4binary/github/license_all_cmakelists_25/Freeind[P]ita/iptables.c",0x67)
  ;
  return;
}

Assistant:

static void free_chain(ip_chain_t *ipc)
{
	if (ipc == NULL) {
		return;
	}

	list_del(&ipc->list);

	ip_rule_t *p = NULL, *q = NULL;

	list_for_each_entry_safe(p, q, &ipc->rules, list) {
		free_rule(p);
	}


	_free(ipc);
}